

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layernorm_x86_avx512.cpp
# Opt level: O3

void ncnn::layernorm(float *ptr,float *gamma_ptr,float *beta_ptr,float eps,int elemcount,
                    int elempack)

{
  int *piVar1;
  uint *puVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  undefined8 uVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  byte bVar36;
  byte bVar37;
  uint uVar38;
  long lVar39;
  ulong uVar40;
  undefined1 auVar48 [32];
  undefined1 (*pauVar41) [64];
  uint uVar42;
  uint uVar43;
  int iVar44;
  ushort uVar45;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar50 [32];
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  undefined1 auVar49 [32];
  undefined1 auVar55 [64];
  undefined1 auVar56 [64];
  undefined1 auVar57 [64];
  undefined1 in_register_00001204 [60];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [64];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  float fVar67;
  float fVar74;
  undefined1 auVar71 [16];
  float fVar73;
  undefined1 auVar72 [64];
  float fVar75;
  float fVar76;
  float fVar83;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  float fVar81;
  float fVar82;
  float fVar84;
  float fVar85;
  float fVar86;
  undefined1 auVar80 [64];
  undefined1 auVar87 [16];
  undefined1 auVar88 [32];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [16];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [64];
  
  auVar57._4_60_ = in_register_00001204;
  auVar57._0_4_ = eps;
  uVar38 = elempack * elemcount;
  pauVar41 = (undefined1 (*) [64])ptr;
  if ((int)uVar38 < 0x10) {
    auVar80 = ZEXT864(0);
    uVar42 = 0;
  }
  else {
    uVar42 = uVar38 & 0x7ffffff0;
    auVar80 = ZEXT864(0);
    iVar44 = 0xf;
    do {
      auVar80 = vaddps_avx512f(auVar80,*pauVar41);
      pauVar41 = pauVar41 + 1;
      iVar44 = iVar44 + 0x10;
    } while (iVar44 < (int)uVar38);
  }
  auVar72 = ZEXT1664(ZEXT816(0) << 0x40);
  if ((int)(uVar42 | 7) < (int)uVar38) {
    auVar72 = ZEXT464(0) << 0x40;
    uVar43 = uVar42;
    do {
      auVar72 = ZEXT3264(CONCAT428(auVar72._28_4_ + *(float *)(*pauVar41 + 0x1c),
                                   CONCAT424(auVar72._24_4_ + *(float *)(*pauVar41 + 0x18),
                                             CONCAT420(auVar72._20_4_ + *(float *)(*pauVar41 + 0x14)
                                                       ,CONCAT416(auVar72._16_4_ +
                                                                  *(float *)(*pauVar41 + 0x10),
                                                                  CONCAT412(auVar72._12_4_ +
                                                                            *(float *)(*pauVar41 +
                                                                                      0xc),
                                                                            CONCAT48(auVar72._8_4_ +
                                                                                     *(float *)(*
                                                  pauVar41 + 8),
                                                  CONCAT44(auVar72._4_4_ + *(float *)(*pauVar41 + 4)
                                                           ,auVar72._0_4_ + *(float *)*pauVar41)))))
                                            )));
      pauVar41 = (undefined1 (*) [64])(*pauVar41 + 0x20);
      uVar42 = uVar43 + 8;
      iVar44 = uVar43 + 0xf;
      uVar43 = uVar42;
    } while (iVar44 < (int)uVar38);
  }
  auVar46 = ZEXT816(0) << 0x40;
  if ((int)(uVar42 | 3) < (int)uVar38) {
    auVar66 = ZEXT464(0) << 0x40;
    uVar43 = uVar42;
    do {
      auVar46._0_4_ = auVar66._0_4_ + *(float *)*pauVar41;
      auVar46._4_4_ = auVar66._4_4_ + *(float *)(*pauVar41 + 4);
      auVar46._8_4_ = auVar66._8_4_ + *(float *)(*pauVar41 + 8);
      auVar46._12_4_ = auVar66._12_4_ + *(float *)(*pauVar41 + 0xc);
      auVar66 = ZEXT1664(auVar46);
      pauVar41 = (undefined1 (*) [64])(*pauVar41 + 0x10);
      uVar42 = uVar43 + 4;
      iVar44 = uVar43 + 7;
      uVar43 = uVar42;
    } while (iVar44 < (int)uVar38);
  }
  auVar60 = ZEXT816(0) << 0x40;
  if ((int)uVar42 < (int)uVar38) {
    auVar51 = vpbroadcastq_avx512f();
    uVar40 = 0;
    auVar52 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar53 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar66 = ZEXT1664(ZEXT816(0) << 0x40);
    do {
      auVar55 = auVar66;
      auVar66 = vpbroadcastq_avx512f();
      auVar54 = vporq_avx512f(auVar66,auVar52);
      auVar66 = vporq_avx512f(auVar66,auVar53);
      uVar24 = vpcmpuq_avx512f(auVar66,auVar51,2);
      bVar36 = (byte)uVar24;
      uVar24 = vpcmpuq_avx512f(auVar54,auVar51,2);
      bVar37 = (byte)uVar24;
      uVar45 = CONCAT11(bVar37,bVar36);
      piVar1 = (int *)(*pauVar41 + uVar40 * 4);
      auVar66._4_4_ = (uint)((byte)(uVar45 >> 1) & 1) * piVar1[1];
      auVar66._0_4_ = (uint)(bVar36 & 1) * *piVar1;
      auVar66._8_4_ = (uint)((byte)(uVar45 >> 2) & 1) * piVar1[2];
      auVar66._12_4_ = (uint)((byte)(uVar45 >> 3) & 1) * piVar1[3];
      auVar66._16_4_ = (uint)((byte)(uVar45 >> 4) & 1) * piVar1[4];
      auVar66._20_4_ = (uint)((byte)(uVar45 >> 5) & 1) * piVar1[5];
      auVar66._24_4_ = (uint)((byte)(uVar45 >> 6) & 1) * piVar1[6];
      auVar66._28_4_ = (uint)((byte)(uVar45 >> 7) & 1) * piVar1[7];
      auVar66._32_4_ = (uint)(bVar37 & 1) * piVar1[8];
      auVar66._36_4_ = (uint)(bVar37 >> 1 & 1) * piVar1[9];
      auVar66._40_4_ = (uint)(bVar37 >> 2 & 1) * piVar1[10];
      auVar66._44_4_ = (uint)(bVar37 >> 3 & 1) * piVar1[0xb];
      auVar66._48_4_ = (uint)(bVar37 >> 4 & 1) * piVar1[0xc];
      auVar66._52_4_ = (uint)(bVar37 >> 5 & 1) * piVar1[0xd];
      auVar66._56_4_ = (uint)(bVar37 >> 6 & 1) * piVar1[0xe];
      auVar66._60_4_ = (uint)(bVar37 >> 7) * piVar1[0xf];
      auVar66 = vaddps_avx512f(auVar66,auVar55);
      uVar40 = uVar40 + 0x10;
    } while (((ulong)(~uVar42 + uVar38) + 0x10 & 0x1fffffff0) != uVar40);
    auVar51._0_4_ = (uint)(bVar36 & 1) * auVar66._0_4_ | (uint)!(bool)(bVar36 & 1) * auVar55._0_4_;
    bVar5 = (bool)((byte)(uVar45 >> 1) & 1);
    auVar51._4_4_ = (uint)bVar5 * auVar66._4_4_ | (uint)!bVar5 * auVar55._4_4_;
    bVar5 = (bool)((byte)(uVar45 >> 2) & 1);
    auVar51._8_4_ = (uint)bVar5 * auVar66._8_4_ | (uint)!bVar5 * auVar55._8_4_;
    bVar5 = (bool)((byte)(uVar45 >> 3) & 1);
    auVar51._12_4_ = (uint)bVar5 * auVar66._12_4_ | (uint)!bVar5 * auVar55._12_4_;
    bVar5 = (bool)((byte)(uVar45 >> 4) & 1);
    auVar51._16_4_ = (uint)bVar5 * auVar66._16_4_ | (uint)!bVar5 * auVar55._16_4_;
    bVar5 = (bool)((byte)(uVar45 >> 5) & 1);
    auVar51._20_4_ = (uint)bVar5 * auVar66._20_4_ | (uint)!bVar5 * auVar55._20_4_;
    bVar5 = (bool)((byte)(uVar45 >> 6) & 1);
    auVar51._24_4_ = (uint)bVar5 * auVar66._24_4_ | (uint)!bVar5 * auVar55._24_4_;
    bVar5 = (bool)((byte)(uVar45 >> 7) & 1);
    auVar51._28_4_ = (uint)bVar5 * auVar66._28_4_ | (uint)!bVar5 * auVar55._28_4_;
    auVar51._32_4_ =
         (uint)(bVar37 & 1) * auVar66._32_4_ | (uint)!(bool)(bVar37 & 1) * auVar55._32_4_;
    bVar5 = (bool)(bVar37 >> 1 & 1);
    auVar51._36_4_ = (uint)bVar5 * auVar66._36_4_ | (uint)!bVar5 * auVar55._36_4_;
    bVar5 = (bool)(bVar37 >> 2 & 1);
    auVar51._40_4_ = (uint)bVar5 * auVar66._40_4_ | (uint)!bVar5 * auVar55._40_4_;
    bVar5 = (bool)(bVar37 >> 3 & 1);
    auVar51._44_4_ = (uint)bVar5 * auVar66._44_4_ | (uint)!bVar5 * auVar55._44_4_;
    bVar5 = (bool)(bVar37 >> 4 & 1);
    auVar51._48_4_ = (uint)bVar5 * auVar66._48_4_ | (uint)!bVar5 * auVar55._48_4_;
    bVar5 = (bool)(bVar37 >> 5 & 1);
    auVar51._52_4_ = (uint)bVar5 * auVar66._52_4_ | (uint)!bVar5 * auVar55._52_4_;
    bVar5 = (bool)(bVar37 >> 6 & 1);
    auVar51._56_4_ = (uint)bVar5 * auVar66._56_4_ | (uint)!bVar5 * auVar55._56_4_;
    auVar51._60_4_ =
         (uint)(bVar37 >> 7) * auVar66._60_4_ | (uint)!(bool)(bVar37 >> 7) * auVar55._60_4_;
    auVar48 = vextractf64x4_avx512f(auVar51,1);
    auVar66 = vaddps_avx512f(auVar51,ZEXT3264(auVar48));
    auVar58._0_4_ = auVar66._0_4_ + auVar66._16_4_;
    auVar58._4_4_ = auVar66._4_4_ + auVar66._20_4_;
    auVar58._8_4_ = auVar66._8_4_ + auVar66._24_4_;
    auVar58._12_4_ = auVar66._12_4_ + auVar66._28_4_;
    auVar60 = vshufpd_avx(auVar58,auVar58,1);
    auVar59._0_4_ = auVar58._0_4_ + auVar60._0_4_;
    auVar59._4_4_ = auVar58._4_4_ + auVar60._4_4_;
    auVar59._8_4_ = auVar58._8_4_ + auVar60._8_4_;
    auVar59._12_4_ = auVar58._12_4_ + auVar60._12_4_;
    auVar60 = vhaddps_avx(auVar59,auVar59);
  }
  if (elempack == 0x10) {
    auVar66 = vbroadcastss_avx512f(ZEXT416((uint)(1.0 / (float)elemcount)));
    auVar80 = vmulps_avx512f(auVar80,auVar66);
LAB_005147ea:
    bVar5 = false;
  }
  else {
    fVar75 = auVar80._0_4_;
    fVar81 = auVar80._4_4_;
    fVar73 = auVar72._0_4_;
    fVar18 = auVar72._4_4_;
    fVar19 = auVar72._8_4_;
    fVar20 = auVar72._12_4_;
    fVar82 = auVar80._8_4_;
    fVar83 = auVar80._12_4_;
    fVar84 = auVar80._16_4_;
    fVar85 = auVar80._24_4_;
    fVar86 = auVar80._28_4_;
    fVar21 = auVar72._16_4_;
    fVar22 = auVar72._24_4_;
    fVar23 = auVar72._28_4_;
    if (elempack == 1) {
      auVar48 = vextractf64x4_avx512f(auVar80,1);
      fVar81 = fVar81 + auVar48._4_4_;
      auVar78._0_4_ = fVar75 + auVar48._0_4_ + fVar84 + auVar48._16_4_;
      auVar78._4_4_ = fVar81 + fVar81;
      auVar78._8_4_ = fVar82 + auVar48._8_4_ + fVar85 + auVar48._24_4_;
      auVar78._12_4_ = fVar83 + auVar48._12_4_ + fVar86 + auVar48._28_4_;
      auVar58 = vshufpd_avx(auVar78,auVar78,1);
      auVar79._0_4_ = auVar58._0_4_ + auVar78._0_4_;
      auVar79._4_4_ = auVar58._4_4_ + auVar78._4_4_;
      auVar79._8_4_ = auVar58._8_4_ + auVar78._8_4_;
      auVar79._12_4_ = auVar58._12_4_ + auVar78._12_4_;
      auVar58 = vmovshdup_avx(auVar79);
      auVar71._0_4_ = fVar21 + fVar73;
      auVar71._4_4_ = auVar72._20_4_ + fVar18;
      auVar71._8_4_ = fVar22 + fVar19;
      auVar71._12_4_ = fVar23 + fVar20;
      auVar59 = vshufps_avx(auVar46,auVar71,0x11);
      auVar46 = vshufps_avx(auVar46,auVar71,0xbb);
      auVar47._0_4_ = auVar46._0_4_ + auVar59._0_4_;
      auVar47._4_4_ = auVar46._4_4_ + auVar59._4_4_;
      auVar47._8_4_ = auVar46._8_4_ + auVar59._8_4_;
      auVar47._12_4_ = auVar46._12_4_ + auVar59._12_4_;
      auVar46 = vshufpd_avx(auVar47,auVar47,1);
      auVar65._0_4_ = auVar47._0_4_ + auVar46._0_4_;
      auVar65._4_4_ = auVar47._4_4_ + auVar46._4_4_;
      auVar65._8_4_ = auVar47._8_4_ + auVar46._8_4_;
      auVar65._12_4_ = auVar47._12_4_ + auVar46._12_4_;
      auVar46 = vhaddps_avx(auVar65,auVar65);
      auVar60._0_4_ =
           (auVar79._0_4_ + auVar58._0_4_ + auVar60._0_4_ + auVar46._0_4_) / (float)elemcount;
      auVar60._4_12_ = SUB6012((undefined1  [60])0x0,0);
      auVar80 = vbroadcastss_avx512f(auVar60);
      auVar46 = auVar80._0_16_;
      bVar8 = true;
      bVar5 = false;
      bVar7 = false;
      auVar72 = ZEXT3264(auVar80._0_32_);
      goto LAB_005147f2;
    }
    if (elempack == 4) {
      auVar48 = vextractf64x4_avx512f(auVar80,1);
      fVar74 = fVar81 + fVar18 + auVar48._4_4_;
      fVar18 = auVar46._4_4_;
      fVar81 = auVar46._8_4_;
      fVar76 = auVar46._12_4_;
      fVar67 = 1.0 / (float)elemcount;
      auVar46._0_4_ =
           (fVar84 + fVar21 + auVar48._16_4_ + fVar75 + fVar73 + auVar48._0_4_ + auVar46._0_4_) *
           fVar67;
      auVar46._4_4_ = (fVar74 + fVar74 + fVar18) * fVar67;
      auVar46._8_4_ =
           (fVar85 + fVar22 + auVar48._24_4_ + fVar82 + fVar19 + auVar48._8_4_ + fVar81) * fVar67;
      auVar46._12_4_ =
           (fVar86 + fVar23 + auVar48._28_4_ + fVar83 + fVar20 + auVar48._12_4_ + fVar76) * fVar67;
      auVar72 = ZEXT3264(CONCAT1616(auVar46,auVar46));
      auVar80 = vshuff64x2_avx512f(ZEXT1664(auVar46),ZEXT1664(auVar46),0);
      bVar7 = true;
      bVar8 = false;
      bVar5 = false;
      goto LAB_005147f2;
    }
    if (elempack != 8) goto LAB_005147ea;
    auVar49 = vextractf64x4_avx512f(auVar80,1);
    fVar76 = 1.0 / (float)elemcount;
    auVar48._4_4_ = (fVar81 + fVar18 + auVar49._4_4_) * fVar76;
    auVar48._0_4_ = (fVar75 + fVar73 + auVar49._0_4_) * fVar76;
    auVar48._8_4_ = (fVar82 + fVar19 + auVar49._8_4_) * fVar76;
    auVar48._12_4_ = (fVar83 + fVar20 + auVar49._12_4_) * fVar76;
    auVar48._16_4_ = (fVar84 + fVar21 + auVar49._16_4_) * fVar76;
    auVar48._20_4_ = (auVar80._20_4_ + auVar72._20_4_ + auVar49._20_4_) * fVar76;
    auVar48._24_4_ = (fVar85 + fVar22 + auVar49._24_4_) * fVar76;
    auVar48._28_4_ = fVar86 + fVar23 + auVar49._28_4_;
    auVar72 = ZEXT3264(auVar48);
    auVar80 = vinsertf64x4_avx512f(auVar72,auVar48,1);
    bVar5 = true;
  }
  bVar8 = false;
  bVar7 = false;
LAB_005147f2:
  auVar49 = auVar72._0_32_;
  pauVar41 = (undefined1 (*) [64])ptr;
  if ((int)uVar38 < 0x10) {
    auVar66 = ZEXT864(0);
    uVar42 = 0;
  }
  else {
    uVar42 = uVar38 & 0x7ffffff0;
    auVar66 = ZEXT864(0);
    iVar44 = 0xf;
    do {
      auVar51 = vsubps_avx512f(*pauVar41,auVar80);
      auVar66 = vfmadd231ps_avx512f(auVar66,auVar51,auVar51);
      pauVar41 = pauVar41 + 1;
      iVar44 = iVar44 + 0x10;
    } while (iVar44 < (int)uVar38);
  }
  auVar88 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
  if ((int)(uVar42 | 7) < (int)uVar38) {
    auVar51 = ZEXT1664((undefined1  [16])0x0);
    uVar43 = uVar42;
    do {
      auVar48 = vsubps_avx(*(undefined1 (*) [32])*pauVar41,auVar49);
      auVar58 = vfmadd231ps_fma(auVar51._0_32_,auVar48,auVar48);
      auVar51 = ZEXT1664(auVar58);
      auVar88 = ZEXT1632(auVar58);
      pauVar41 = (undefined1 (*) [64])(*pauVar41 + 0x20);
      uVar42 = uVar43 + 8;
      iVar44 = uVar43 + 0xf;
      uVar43 = uVar42;
    } while (iVar44 < (int)uVar38);
  }
  auVar58 = ZEXT816(0) << 0x40;
  if ((int)(uVar42 | 3) < (int)uVar38) {
    auVar51 = ZEXT464(0) << 0x40;
    uVar43 = uVar42;
    do {
      auVar58 = vsubps_avx(*(undefined1 (*) [16])*pauVar41,auVar46);
      auVar58 = vfmadd231ps_fma(auVar51._0_16_,auVar58,auVar58);
      auVar51 = ZEXT1664(auVar58);
      pauVar41 = (undefined1 (*) [64])(*pauVar41 + 0x10);
      uVar42 = uVar43 + 4;
      iVar44 = uVar43 + 7;
      uVar43 = uVar42;
    } while (iVar44 < (int)uVar38);
  }
  auVar59 = ZEXT816(0) << 0x40;
  if ((int)uVar42 < (int)uVar38) {
    auVar52 = vpbroadcastq_avx512f();
    auVar53 = vbroadcastss_avx512f(auVar60);
    uVar40 = 0;
    auVar54 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar55 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar51 = ZEXT1664(ZEXT816(0) << 0x40);
    do {
      auVar101 = auVar51;
      auVar51 = vpbroadcastq_avx512f();
      auVar56 = vporq_avx512f(auVar51,auVar54);
      auVar51 = vporq_avx512f(auVar51,auVar55);
      uVar24 = vpcmpuq_avx512f(auVar51,auVar52,2);
      bVar36 = (byte)uVar24;
      uVar24 = vpcmpuq_avx512f(auVar56,auVar52,2);
      bVar37 = (byte)uVar24;
      uVar45 = CONCAT11(bVar37,bVar36);
      piVar1 = (int *)(*pauVar41 + uVar40 * 4);
      auVar56._4_4_ = (uint)((byte)(uVar45 >> 1) & 1) * piVar1[1];
      auVar56._0_4_ = (uint)(bVar36 & 1) * *piVar1;
      auVar56._8_4_ = (uint)((byte)(uVar45 >> 2) & 1) * piVar1[2];
      auVar56._12_4_ = (uint)((byte)(uVar45 >> 3) & 1) * piVar1[3];
      auVar56._16_4_ = (uint)((byte)(uVar45 >> 4) & 1) * piVar1[4];
      auVar56._20_4_ = (uint)((byte)(uVar45 >> 5) & 1) * piVar1[5];
      auVar56._24_4_ = (uint)((byte)(uVar45 >> 6) & 1) * piVar1[6];
      auVar56._28_4_ = (uint)((byte)(uVar45 >> 7) & 1) * piVar1[7];
      auVar56._32_4_ = (uint)(bVar37 & 1) * piVar1[8];
      auVar56._36_4_ = (uint)(bVar37 >> 1 & 1) * piVar1[9];
      auVar56._40_4_ = (uint)(bVar37 >> 2 & 1) * piVar1[10];
      auVar56._44_4_ = (uint)(bVar37 >> 3 & 1) * piVar1[0xb];
      auVar56._48_4_ = (uint)(bVar37 >> 4 & 1) * piVar1[0xc];
      auVar56._52_4_ = (uint)(bVar37 >> 5 & 1) * piVar1[0xd];
      auVar56._56_4_ = (uint)(bVar37 >> 6 & 1) * piVar1[0xe];
      auVar56._60_4_ = (uint)(bVar37 >> 7) * piVar1[0xf];
      auVar51 = vsubps_avx512f(auVar56,auVar53);
      auVar51 = vfmadd213ps_avx512f(auVar51,auVar51,auVar101);
      uVar40 = uVar40 + 0x10;
    } while (((ulong)(~uVar42 + uVar38) + 0x10 & 0x1fffffff0) != uVar40);
    auVar52._0_4_ = (uint)(bVar36 & 1) * auVar51._0_4_ | (uint)!(bool)(bVar36 & 1) * auVar101._0_4_;
    bVar6 = (bool)((byte)(uVar45 >> 1) & 1);
    auVar52._4_4_ = (uint)bVar6 * auVar51._4_4_ | (uint)!bVar6 * auVar101._4_4_;
    bVar6 = (bool)((byte)(uVar45 >> 2) & 1);
    auVar52._8_4_ = (uint)bVar6 * auVar51._8_4_ | (uint)!bVar6 * auVar101._8_4_;
    bVar6 = (bool)((byte)(uVar45 >> 3) & 1);
    auVar52._12_4_ = (uint)bVar6 * auVar51._12_4_ | (uint)!bVar6 * auVar101._12_4_;
    bVar6 = (bool)((byte)(uVar45 >> 4) & 1);
    auVar52._16_4_ = (uint)bVar6 * auVar51._16_4_ | (uint)!bVar6 * auVar101._16_4_;
    bVar6 = (bool)((byte)(uVar45 >> 5) & 1);
    auVar52._20_4_ = (uint)bVar6 * auVar51._20_4_ | (uint)!bVar6 * auVar101._20_4_;
    bVar6 = (bool)((byte)(uVar45 >> 6) & 1);
    auVar52._24_4_ = (uint)bVar6 * auVar51._24_4_ | (uint)!bVar6 * auVar101._24_4_;
    bVar6 = (bool)((byte)(uVar45 >> 7) & 1);
    auVar52._28_4_ = (uint)bVar6 * auVar51._28_4_ | (uint)!bVar6 * auVar101._28_4_;
    auVar52._32_4_ =
         (uint)(bVar37 & 1) * auVar51._32_4_ | (uint)!(bool)(bVar37 & 1) * auVar101._32_4_;
    bVar6 = (bool)(bVar37 >> 1 & 1);
    auVar52._36_4_ = (uint)bVar6 * auVar51._36_4_ | (uint)!bVar6 * auVar101._36_4_;
    bVar6 = (bool)(bVar37 >> 2 & 1);
    auVar52._40_4_ = (uint)bVar6 * auVar51._40_4_ | (uint)!bVar6 * auVar101._40_4_;
    bVar6 = (bool)(bVar37 >> 3 & 1);
    auVar52._44_4_ = (uint)bVar6 * auVar51._44_4_ | (uint)!bVar6 * auVar101._44_4_;
    bVar6 = (bool)(bVar37 >> 4 & 1);
    auVar52._48_4_ = (uint)bVar6 * auVar51._48_4_ | (uint)!bVar6 * auVar101._48_4_;
    bVar6 = (bool)(bVar37 >> 5 & 1);
    auVar52._52_4_ = (uint)bVar6 * auVar51._52_4_ | (uint)!bVar6 * auVar101._52_4_;
    bVar6 = (bool)(bVar37 >> 6 & 1);
    auVar52._56_4_ = (uint)bVar6 * auVar51._56_4_ | (uint)!bVar6 * auVar101._56_4_;
    auVar52._60_4_ =
         (uint)(bVar37 >> 7) * auVar51._60_4_ | (uint)!(bool)(bVar37 >> 7) * auVar101._60_4_;
    auVar48 = vextractf64x4_avx512f(auVar52,1);
    auVar51 = vaddps_avx512f(auVar52,ZEXT3264(auVar48));
    auVar89._0_4_ = auVar51._16_4_ + auVar51._0_4_;
    auVar89._4_4_ = auVar51._20_4_ + auVar51._4_4_;
    auVar89._8_4_ = auVar51._24_4_ + auVar51._8_4_;
    auVar89._12_4_ = auVar51._28_4_ + auVar51._12_4_;
    auVar59 = vshufpd_avx(auVar89,auVar89,1);
    auVar90._0_4_ = auVar59._0_4_ + auVar89._0_4_;
    auVar90._4_4_ = auVar59._4_4_ + auVar89._4_4_;
    auVar90._8_4_ = auVar59._8_4_ + auVar89._8_4_;
    auVar90._12_4_ = auVar59._12_4_ + auVar89._12_4_;
    auVar59 = vhaddps_avx(auVar90,auVar90);
  }
  if (elempack == 0x10) {
    auVar57 = vbroadcastss_avx512f(auVar57._0_16_);
    auVar51 = vbroadcastss_avx512f(ZEXT416((uint)(1.0 / (float)elemcount)));
    auVar57 = vfmadd213ps_avx512f(auVar51,auVar66,auVar57);
    auVar48 = vrsqrtps_avx(auVar57._0_32_);
    auVar50 = vextractf64x4_avx512f(auVar57,1);
    auVar50 = vrsqrtps_avx(auVar50);
    auVar66 = vinsertf64x4_avx512f(ZEXT3264(auVar48),auVar50,1);
    auVar80 = vmulps_avx512f(auVar66,auVar80);
  }
  if (bVar5) {
    auVar48 = vextractf64x4_avx512f(auVar66,1);
    auVar50._0_4_ = auVar66._0_4_ + auVar88._0_4_ + auVar48._0_4_;
    auVar50._4_4_ = auVar66._4_4_ + auVar88._4_4_ + auVar48._4_4_;
    auVar50._8_4_ = auVar66._8_4_ + auVar88._8_4_ + auVar48._8_4_;
    auVar50._12_4_ = auVar66._12_4_ + auVar88._12_4_ + auVar48._12_4_;
    auVar50._16_4_ = auVar66._16_4_ + auVar88._16_4_ + auVar48._16_4_;
    auVar50._20_4_ = auVar66._20_4_ + auVar88._20_4_ + auVar48._20_4_;
    auVar50._24_4_ = auVar66._24_4_ + auVar88._24_4_ + auVar48._24_4_;
    auVar50._28_4_ = auVar66._28_4_ + auVar88._28_4_ + auVar48._28_4_;
    auVar92._4_4_ = eps;
    auVar92._0_4_ = eps;
    auVar92._8_4_ = eps;
    auVar92._12_4_ = eps;
    auVar92._16_4_ = eps;
    auVar92._20_4_ = eps;
    auVar92._24_4_ = eps;
    auVar92._28_4_ = eps;
    auVar91._0_4_ = 1.0 / (float)elemcount;
    auVar91._4_4_ = auVar91._0_4_;
    auVar91._8_4_ = auVar91._0_4_;
    auVar91._12_4_ = auVar91._0_4_;
    auVar91._16_4_ = auVar91._0_4_;
    auVar91._20_4_ = auVar91._0_4_;
    auVar91._24_4_ = auVar91._0_4_;
    auVar91._28_4_ = auVar91._0_4_;
    auVar47 = vfmadd213ps_fma(auVar91,auVar50,auVar92);
    auVar88 = vrsqrtps_avx(ZEXT1632(auVar47));
    auVar80._0_4_ = auVar88._0_4_ * auVar72._0_4_;
    auVar80._4_4_ = auVar88._4_4_ * auVar72._4_4_;
    auVar80._8_4_ = auVar88._8_4_ * auVar72._8_4_;
    auVar80._12_4_ = auVar88._12_4_ * auVar72._12_4_;
    auVar80._16_4_ = auVar88._16_4_ * auVar72._16_4_;
    auVar80._20_4_ = auVar88._20_4_ * auVar72._20_4_;
    auVar80._28_36_ = auVar72._28_36_;
    auVar80._24_4_ = auVar88._24_4_ * auVar72._24_4_;
    auVar49 = auVar80._0_32_;
    auVar66 = vinsertf64x4_avx512f(ZEXT3264(auVar88),auVar88,1);
    auVar80 = vinsertf64x4_avx512f(ZEXT3264(auVar49),auVar49,1);
  }
  auVar61 = auVar46;
  if (bVar7) {
    auVar48 = vextractf64x4_avx512f(auVar66,1);
    fVar73 = auVar66._4_4_ + auVar88._4_4_ + auVar48._4_4_;
    auVar68._0_4_ =
         auVar66._0_4_ + auVar88._0_4_ + auVar48._0_4_ +
         auVar66._16_4_ + auVar88._16_4_ + auVar48._16_4_ + auVar58._0_4_;
    auVar68._4_4_ = fVar73 + fVar73 + auVar58._4_4_;
    auVar68._8_4_ =
         auVar66._8_4_ + auVar88._8_4_ + auVar48._8_4_ +
         auVar66._24_4_ + auVar88._24_4_ + auVar48._24_4_ + auVar58._8_4_;
    auVar68._12_4_ =
         auVar66._12_4_ + auVar88._12_4_ + auVar48._12_4_ +
         auVar66._28_4_ + auVar88._28_4_ + auVar48._28_4_ + auVar58._12_4_;
    auVar87._4_4_ = eps;
    auVar87._0_4_ = eps;
    auVar87._8_4_ = eps;
    auVar87._12_4_ = eps;
    auVar77._0_4_ = 1.0 / (float)elemcount;
    auVar77._4_4_ = auVar77._0_4_;
    auVar77._8_4_ = auVar77._0_4_;
    auVar77._12_4_ = auVar77._0_4_;
    auVar58 = vfmadd213ps_fma(auVar77,auVar68,auVar87);
    auVar58 = vrsqrtps_avx(auVar58);
    auVar61._0_4_ = auVar58._0_4_ * auVar46._0_4_;
    auVar61._4_4_ = auVar58._4_4_ * auVar46._4_4_;
    auVar61._8_4_ = auVar58._8_4_ * auVar46._8_4_;
    auVar61._12_4_ = auVar58._12_4_ * auVar46._12_4_;
    auVar88._16_16_ = auVar58;
    auVar88._0_16_ = auVar58;
    auVar49._16_16_ = auVar61;
    auVar49._0_16_ = auVar61;
    auVar66 = vshuff64x2_avx512f(ZEXT1664(auVar58),ZEXT1664(auVar58),0);
    auVar80 = vshuff64x2_avx512f(ZEXT1664(auVar61),ZEXT1664(auVar61),0);
  }
  if (bVar8) {
    auVar48 = vextractf64x4_avx512f(auVar66,1);
    fVar73 = auVar66._4_4_ + auVar48._4_4_;
    auVar62._0_4_ = auVar66._0_4_ + auVar48._0_4_ + auVar66._16_4_ + auVar48._16_4_;
    auVar62._4_4_ = fVar73 + fVar73;
    auVar62._8_4_ = auVar66._8_4_ + auVar48._8_4_ + auVar66._24_4_ + auVar48._24_4_;
    auVar62._12_4_ = auVar66._12_4_ + auVar48._12_4_ + auVar66._28_4_ + auVar48._28_4_;
    auVar69._0_4_ = auVar88._16_4_ + auVar88._0_4_;
    auVar69._4_4_ = auVar88._20_4_ + auVar88._4_4_;
    auVar69._8_4_ = auVar88._24_4_ + auVar88._8_4_;
    auVar69._12_4_ = auVar88._28_4_ + auVar88._12_4_;
    auVar47 = vshufpd_avx(auVar58,auVar58,1);
    auVar46 = vshufps_avx(auVar62,auVar69,0x11);
    auVar65 = vshufps_avx(auVar62,auVar69,0xbb);
    auVar63._0_4_ = auVar65._0_4_ + auVar46._0_4_;
    auVar63._4_4_ = auVar65._4_4_ + auVar46._4_4_;
    auVar63._8_4_ = auVar65._8_4_ + auVar46._8_4_;
    auVar63._12_4_ = auVar65._12_4_ + auVar46._12_4_;
    auVar46 = vshufpd_avx(auVar63,auVar63,1);
    auVar64._0_4_ = auVar63._0_4_ + auVar46._0_4_;
    auVar64._4_4_ = auVar63._4_4_ + auVar46._4_4_;
    auVar64._8_4_ = auVar63._8_4_ + auVar46._8_4_;
    auVar64._12_4_ = auVar63._12_4_ + auVar46._12_4_;
    auVar46 = vhaddps_avx(auVar64,auVar64);
    auVar70._0_4_ = auVar47._0_4_ + auVar58._0_4_;
    auVar70._4_4_ = auVar47._4_4_ + auVar58._4_4_;
    auVar70._8_4_ = auVar47._8_4_ + auVar58._8_4_;
    auVar70._12_4_ = auVar47._12_4_ + auVar58._12_4_;
    auVar58 = vmovshdup_avx(auVar70);
    auVar46 = ZEXT416((uint)((auVar58._0_4_ + auVar46._0_4_ + auVar70._0_4_ + auVar59._0_4_) /
                             (float)elemcount + eps));
    auVar46 = vsqrtss_avx(auVar46,auVar46);
    fVar73 = 1.0 / auVar46._0_4_;
    auVar59 = ZEXT416((uint)fVar73);
    fVar73 = fVar73 * auVar60._0_4_;
    auVar60 = ZEXT416((uint)fVar73);
    auVar66 = vbroadcastss_avx512f(auVar59);
    auVar58 = auVar66._0_16_;
    auVar80 = vbroadcastss_avx512f(ZEXT416((uint)fVar73));
    auVar61 = auVar80._0_16_;
    auVar88 = auVar66._0_32_;
    auVar49 = auVar80._0_32_;
  }
  if (gamma_ptr == (float *)0x0 || beta_ptr == (float *)0x0) {
    uVar42 = 0;
    if (0xf < (int)uVar38) {
      auVar72._8_4_ = 0x80000000;
      auVar72._0_8_ = 0x8000000080000000;
      auVar72._12_4_ = 0x80000000;
      auVar72._16_4_ = 0x80000000;
      auVar72._20_4_ = 0x80000000;
      auVar72._24_4_ = 0x80000000;
      auVar72._28_4_ = 0x80000000;
      auVar72._32_4_ = 0x80000000;
      auVar72._36_4_ = 0x80000000;
      auVar72._40_4_ = 0x80000000;
      auVar72._44_4_ = 0x80000000;
      auVar72._48_4_ = 0x80000000;
      auVar72._52_4_ = 0x80000000;
      auVar72._56_4_ = 0x80000000;
      auVar72._60_4_ = 0x80000000;
      auVar57 = vxorps_avx512dq(auVar80,auVar72);
      uVar42 = uVar38 & 0x7ffffff0;
      iVar44 = 0xf;
      do {
        auVar80 = vfmadd132ps_avx512f(*(undefined1 (*) [64])ptr,auVar57,auVar66);
        *(undefined1 (*) [64])ptr = auVar80;
        ptr = (float *)((long)ptr + 0x40);
        iVar44 = iVar44 + 0x10;
      } while (iVar44 < (int)uVar38);
    }
    if ((int)(uVar42 | 7) < (int)uVar38) {
      auVar33._8_4_ = 0x80000000;
      auVar33._0_8_ = 0x8000000080000000;
      auVar33._12_4_ = 0x80000000;
      auVar33._16_4_ = 0x80000000;
      auVar33._20_4_ = 0x80000000;
      auVar33._24_4_ = 0x80000000;
      auVar33._28_4_ = 0x80000000;
      auVar48 = vxorps_avx512vl(auVar49,auVar33);
      uVar43 = uVar42;
      do {
        auVar46 = vfmadd132ps_fma(*(undefined1 (*) [32])*(undefined1 (*) [64])ptr,auVar48,auVar88);
        *(undefined1 (*) [32])*(undefined1 (*) [64])ptr = ZEXT1632(auVar46);
        ptr = (float *)(*(undefined1 (*) [64])ptr + 0x20);
        uVar42 = uVar43 + 8;
        iVar44 = uVar43 + 0xf;
        uVar43 = uVar42;
      } while (iVar44 < (int)uVar38);
    }
    if ((int)(uVar42 | 3) < (int)uVar38) {
      auVar28._8_4_ = 0x80000000;
      auVar28._0_8_ = 0x8000000080000000;
      auVar28._12_4_ = 0x80000000;
      auVar46 = vxorps_avx512vl(auVar61,auVar28);
      uVar43 = uVar42;
      do {
        auVar47 = vfmadd132ps_fma(*(undefined1 (*) [16])*(undefined1 (*) [64])ptr,auVar46,auVar58);
        *(undefined1 (*) [16])*(undefined1 (*) [64])ptr = auVar47;
        ptr = (float *)(*(undefined1 (*) [64])ptr + 0x10);
        uVar42 = uVar43 + 4;
        iVar44 = uVar43 + 7;
        uVar43 = uVar42;
      } while (iVar44 < (int)uVar38);
    }
    if ((int)uVar42 < (int)uVar38) {
      auVar57 = vpbroadcastq_avx512f();
      auVar80 = vbroadcastss_avx512f(auVar59);
      auVar72 = vbroadcastss_avx512f(auVar60);
      uVar40 = 0;
      auVar66 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar51 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      do {
        auVar52 = vpbroadcastq_avx512f();
        auVar53 = vporq_avx512f(auVar52,auVar66);
        auVar52 = vporq_avx512f(auVar52,auVar51);
        uVar24 = vpcmpuq_avx512f(auVar52,auVar57,2);
        bVar36 = (byte)uVar24;
        uVar24 = vpcmpuq_avx512f(auVar53,auVar57,2);
        bVar37 = (byte)uVar24;
        uVar45 = CONCAT11(bVar37,bVar36);
        piVar1 = (int *)(*(undefined1 (*) [64])ptr + uVar40 * 4);
        auVar53._4_4_ = (uint)((byte)(uVar45 >> 1) & 1) * piVar1[1];
        auVar53._0_4_ = (uint)(bVar36 & 1) * *piVar1;
        auVar53._8_4_ = (uint)((byte)(uVar45 >> 2) & 1) * piVar1[2];
        auVar53._12_4_ = (uint)((byte)(uVar45 >> 3) & 1) * piVar1[3];
        auVar53._16_4_ = (uint)((byte)(uVar45 >> 4) & 1) * piVar1[4];
        auVar53._20_4_ = (uint)((byte)(uVar45 >> 5) & 1) * piVar1[5];
        auVar53._24_4_ = (uint)((byte)(uVar45 >> 6) & 1) * piVar1[6];
        auVar53._28_4_ = (uint)((byte)(uVar45 >> 7) & 1) * piVar1[7];
        auVar53._32_4_ = (uint)(bVar37 & 1) * piVar1[8];
        auVar53._36_4_ = (uint)(bVar37 >> 1 & 1) * piVar1[9];
        auVar53._40_4_ = (uint)(bVar37 >> 2 & 1) * piVar1[10];
        auVar53._44_4_ = (uint)(bVar37 >> 3 & 1) * piVar1[0xb];
        auVar53._48_4_ = (uint)(bVar37 >> 4 & 1) * piVar1[0xc];
        auVar53._52_4_ = (uint)(bVar37 >> 5 & 1) * piVar1[0xd];
        auVar53._56_4_ = (uint)(bVar37 >> 6 & 1) * piVar1[0xe];
        auVar53._60_4_ = (uint)(bVar37 >> 7) * piVar1[0xf];
        auVar52 = vfmsub213ps_avx512f(auVar53,auVar80,auVar72);
        puVar2 = (uint *)(*(undefined1 (*) [64])ptr + uVar40 * 4);
        bVar5 = (bool)((byte)(uVar45 >> 1) & 1);
        bVar7 = (bool)((byte)(uVar45 >> 2) & 1);
        bVar8 = (bool)((byte)(uVar45 >> 3) & 1);
        bVar6 = (bool)((byte)(uVar45 >> 4) & 1);
        bVar9 = (bool)((byte)(uVar45 >> 5) & 1);
        bVar10 = (bool)((byte)(uVar45 >> 6) & 1);
        bVar11 = (bool)((byte)(uVar45 >> 7) & 1);
        bVar12 = (bool)(bVar37 >> 1 & 1);
        bVar13 = (bool)(bVar37 >> 2 & 1);
        bVar14 = (bool)(bVar37 >> 3 & 1);
        bVar15 = (bool)(bVar37 >> 4 & 1);
        bVar16 = (bool)(bVar37 >> 5 & 1);
        bVar17 = (bool)(bVar37 >> 6 & 1);
        *puVar2 = (uint)(bVar36 & 1) * auVar52._0_4_ | (uint)!(bool)(bVar36 & 1) * *puVar2;
        puVar2[1] = (uint)bVar5 * auVar52._4_4_ | (uint)!bVar5 * puVar2[1];
        puVar2[2] = (uint)bVar7 * auVar52._8_4_ | (uint)!bVar7 * puVar2[2];
        puVar2[3] = (uint)bVar8 * auVar52._12_4_ | (uint)!bVar8 * puVar2[3];
        puVar2[4] = (uint)bVar6 * auVar52._16_4_ | (uint)!bVar6 * puVar2[4];
        puVar2[5] = (uint)bVar9 * auVar52._20_4_ | (uint)!bVar9 * puVar2[5];
        puVar2[6] = (uint)bVar10 * auVar52._24_4_ | (uint)!bVar10 * puVar2[6];
        puVar2[7] = (uint)bVar11 * auVar52._28_4_ | (uint)!bVar11 * puVar2[7];
        puVar2[8] = (uint)(bVar37 & 1) * auVar52._32_4_ | (uint)!(bool)(bVar37 & 1) * puVar2[8];
        puVar2[9] = (uint)bVar12 * auVar52._36_4_ | (uint)!bVar12 * puVar2[9];
        puVar2[10] = (uint)bVar13 * auVar52._40_4_ | (uint)!bVar13 * puVar2[10];
        puVar2[0xb] = (uint)bVar14 * auVar52._44_4_ | (uint)!bVar14 * puVar2[0xb];
        puVar2[0xc] = (uint)bVar15 * auVar52._48_4_ | (uint)!bVar15 * puVar2[0xc];
        puVar2[0xd] = (uint)bVar16 * auVar52._52_4_ | (uint)!bVar16 * puVar2[0xd];
        puVar2[0xe] = (uint)bVar17 * auVar52._56_4_ | (uint)!bVar17 * puVar2[0xe];
        puVar2[0xf] = (uint)(bVar37 >> 7) * auVar52._60_4_ |
                      (uint)!(bool)(bVar37 >> 7) * puVar2[0xf];
        uVar40 = uVar40 + 0x10;
      } while (((ulong)(uVar38 + ~uVar42) + 0x10 & 0x1fffffff0) != uVar40);
    }
  }
  else {
    uVar42 = 0;
    if (0xf < (int)uVar38 && elempack == 0x10) {
      auVar54._8_4_ = 0x80000000;
      auVar54._0_8_ = 0x8000000080000000;
      auVar54._12_4_ = 0x80000000;
      auVar54._16_4_ = 0x80000000;
      auVar54._20_4_ = 0x80000000;
      auVar54._24_4_ = 0x80000000;
      auVar54._28_4_ = 0x80000000;
      auVar54._32_4_ = 0x80000000;
      auVar54._36_4_ = 0x80000000;
      auVar54._40_4_ = 0x80000000;
      auVar54._44_4_ = 0x80000000;
      auVar54._48_4_ = 0x80000000;
      auVar54._52_4_ = 0x80000000;
      auVar54._56_4_ = 0x80000000;
      auVar54._60_4_ = 0x80000000;
      auVar57 = vxorps_avx512dq(auVar80,auVar54);
      iVar44 = 0xf;
      do {
        auVar72 = vbroadcastss_avx512f(ZEXT416(*(uint *)*(undefined1 (*) [64])gamma_ptr));
        auVar51 = vfmadd132ps_avx512f(*(undefined1 (*) [64])ptr,auVar57,auVar66);
        uVar3 = *(undefined4 *)*(undefined1 (*) [64])beta_ptr;
        auVar55._4_4_ = uVar3;
        auVar55._0_4_ = uVar3;
        auVar55._8_4_ = uVar3;
        auVar55._12_4_ = uVar3;
        auVar55._16_4_ = uVar3;
        auVar55._20_4_ = uVar3;
        auVar55._24_4_ = uVar3;
        auVar55._28_4_ = uVar3;
        auVar55._32_4_ = uVar3;
        auVar55._36_4_ = uVar3;
        auVar55._40_4_ = uVar3;
        auVar55._44_4_ = uVar3;
        auVar55._48_4_ = uVar3;
        auVar55._52_4_ = uVar3;
        auVar55._56_4_ = uVar3;
        auVar55._60_4_ = uVar3;
        auVar72 = vfmadd213ps_avx512f(auVar51,auVar72,auVar55);
        *(undefined1 (*) [64])ptr = auVar72;
        ptr = (float *)((long)ptr + 0x40);
        gamma_ptr = (float *)(*(undefined1 (*) [64])gamma_ptr + 4);
        beta_ptr = (float *)(*(undefined1 (*) [64])beta_ptr + 4);
        iVar44 = iVar44 + 0x10;
        uVar42 = uVar38;
      } while (iVar44 < (int)uVar38);
    }
    if (bVar5) {
      if ((int)(uVar42 | 0xf) < (int)uVar38) {
        auVar101._8_4_ = 0x80000000;
        auVar101._0_8_ = 0x8000000080000000;
        auVar101._12_4_ = 0x80000000;
        auVar101._16_4_ = 0x80000000;
        auVar101._20_4_ = 0x80000000;
        auVar101._24_4_ = 0x80000000;
        auVar101._28_4_ = 0x80000000;
        auVar101._32_4_ = 0x80000000;
        auVar101._36_4_ = 0x80000000;
        auVar101._40_4_ = 0x80000000;
        auVar101._44_4_ = 0x80000000;
        auVar101._48_4_ = 0x80000000;
        auVar101._52_4_ = 0x80000000;
        auVar101._56_4_ = 0x80000000;
        auVar101._60_4_ = 0x80000000;
        auVar57 = vxorps_avx512dq(auVar80,auVar101);
        uVar43 = uVar42;
        do {
          uVar3 = *(undefined4 *)*(undefined1 (*) [64])gamma_ptr;
          uVar4 = *(undefined4 *)(*(undefined1 (*) [64])gamma_ptr + 4);
          auVar97._4_4_ = uVar4;
          auVar97._0_4_ = uVar4;
          auVar97._8_4_ = uVar4;
          auVar97._12_4_ = uVar4;
          auVar97._16_4_ = uVar4;
          auVar97._20_4_ = uVar4;
          auVar97._24_4_ = uVar4;
          auVar97._28_4_ = uVar4;
          auVar72 = vinsertf64x4_avx512f
                              (ZEXT3264(CONCAT428(uVar3,CONCAT424(uVar3,CONCAT420(uVar3,CONCAT416(
                                                  uVar3,CONCAT412(uVar3,CONCAT48(uVar3,CONCAT44(
                                                  uVar3,uVar3)))))))),auVar97,1);
          uVar3 = *(undefined4 *)*(undefined1 (*) [64])beta_ptr;
          uVar4 = *(undefined4 *)(*(undefined1 (*) [64])beta_ptr + 4);
          auVar100._4_4_ = uVar4;
          auVar100._0_4_ = uVar4;
          auVar100._8_4_ = uVar4;
          auVar100._12_4_ = uVar4;
          auVar100._16_4_ = uVar4;
          auVar100._20_4_ = uVar4;
          auVar100._24_4_ = uVar4;
          auVar100._28_4_ = uVar4;
          auVar51 = vinsertf64x4_avx512f
                              (ZEXT3264(CONCAT428(uVar3,CONCAT424(uVar3,CONCAT420(uVar3,CONCAT416(
                                                  uVar3,CONCAT412(uVar3,CONCAT48(uVar3,CONCAT44(
                                                  uVar3,uVar3)))))))),auVar100,1);
          auVar52 = vfmadd132ps_avx512f(*(undefined1 (*) [64])ptr,auVar57,auVar66);
          auVar72 = vfmadd213ps_avx512f(auVar52,auVar72,auVar51);
          *(undefined1 (*) [64])ptr = auVar72;
          ptr = (float *)((long)ptr + 0x40);
          gamma_ptr = (float *)(*(undefined1 (*) [64])gamma_ptr + 8);
          beta_ptr = (float *)(*(undefined1 (*) [64])beta_ptr + 8);
          uVar42 = uVar43 + 0x10;
          iVar44 = uVar43 + 0x1f;
          uVar43 = uVar42;
        } while (iVar44 < (int)uVar38);
      }
      if ((int)(uVar42 | 7) < (int)uVar38) {
        auVar29._8_4_ = 0x80000000;
        auVar29._0_8_ = 0x8000000080000000;
        auVar29._12_4_ = 0x80000000;
        auVar29._16_4_ = 0x80000000;
        auVar29._20_4_ = 0x80000000;
        auVar29._24_4_ = 0x80000000;
        auVar29._28_4_ = 0x80000000;
        auVar48 = vxorps_avx512vl(auVar49,auVar29);
        uVar43 = uVar42;
        do {
          uVar3 = *(undefined4 *)*(undefined1 (*) [64])gamma_ptr;
          auVar94._4_4_ = uVar3;
          auVar94._0_4_ = uVar3;
          auVar94._8_4_ = uVar3;
          auVar94._12_4_ = uVar3;
          auVar94._16_4_ = uVar3;
          auVar94._20_4_ = uVar3;
          auVar94._24_4_ = uVar3;
          auVar94._28_4_ = uVar3;
          auVar46 = vfmadd132ps_fma(*(undefined1 (*) [32])*(undefined1 (*) [64])ptr,auVar48,auVar88)
          ;
          uVar3 = *(undefined4 *)*(undefined1 (*) [64])beta_ptr;
          auVar30._4_4_ = uVar3;
          auVar30._0_4_ = uVar3;
          auVar30._8_4_ = uVar3;
          auVar30._12_4_ = uVar3;
          auVar30._16_4_ = uVar3;
          auVar30._20_4_ = uVar3;
          auVar30._24_4_ = uVar3;
          auVar30._28_4_ = uVar3;
          auVar50 = vfmadd213ps_avx512vl(ZEXT1632(auVar46),auVar94,auVar30);
          *(undefined1 (*) [32])*(undefined1 (*) [64])ptr = auVar50;
          ptr = (float *)(*(undefined1 (*) [64])ptr + 0x20);
          gamma_ptr = (float *)(*(undefined1 (*) [64])gamma_ptr + 4);
          beta_ptr = (float *)(*(undefined1 (*) [64])beta_ptr + 4);
          uVar42 = uVar43 + 8;
          iVar44 = uVar43 + 0xf;
          uVar43 = uVar42;
        } while (iVar44 < (int)uVar38);
      }
    }
    if (bVar7) {
      if ((int)(uVar42 + 0xf) < (int)uVar38) {
        auVar34._8_4_ = 0x80000000;
        auVar34._0_8_ = 0x8000000080000000;
        auVar34._12_4_ = 0x80000000;
        auVar34._16_4_ = 0x80000000;
        auVar34._20_4_ = 0x80000000;
        auVar34._24_4_ = 0x80000000;
        auVar34._28_4_ = 0x80000000;
        auVar34._32_4_ = 0x80000000;
        auVar34._36_4_ = 0x80000000;
        auVar34._40_4_ = 0x80000000;
        auVar34._44_4_ = 0x80000000;
        auVar34._48_4_ = 0x80000000;
        auVar34._52_4_ = 0x80000000;
        auVar34._56_4_ = 0x80000000;
        auVar34._60_4_ = 0x80000000;
        auVar57 = vxorps_avx512dq(auVar80,auVar34);
        uVar43 = uVar42;
        do {
          uVar3 = *(undefined4 *)(*(undefined1 (*) [64])gamma_ptr + 8);
          auVar95._4_4_ = uVar3;
          auVar95._0_4_ = uVar3;
          auVar95._8_4_ = uVar3;
          auVar95._12_4_ = uVar3;
          uVar3 = *(undefined4 *)(*(undefined1 (*) [64])gamma_ptr + 0xc);
          auVar95._20_4_ = uVar3;
          auVar95._16_4_ = uVar3;
          auVar95._24_4_ = uVar3;
          auVar95._28_4_ = uVar3;
          uVar3 = *(undefined4 *)*(undefined1 (*) [64])gamma_ptr;
          uVar4 = *(undefined4 *)(*(undefined1 (*) [64])gamma_ptr + 4);
          auVar72 = vinsertf64x4_avx512f
                              (ZEXT3264(CONCAT1616(CONCAT412(uVar4,CONCAT48(uVar4,CONCAT44(uVar4,
                                                  uVar4))),CONCAT412(uVar3,CONCAT48(uVar3,CONCAT44(
                                                  uVar3,uVar3))))),auVar95,1);
          uVar3 = *(undefined4 *)(*(undefined1 (*) [64])beta_ptr + 8);
          auVar98._4_4_ = uVar3;
          auVar98._0_4_ = uVar3;
          auVar98._8_4_ = uVar3;
          auVar98._12_4_ = uVar3;
          uVar3 = *(undefined4 *)(*(undefined1 (*) [64])beta_ptr + 0xc);
          auVar98._20_4_ = uVar3;
          auVar98._16_4_ = uVar3;
          auVar98._24_4_ = uVar3;
          auVar98._28_4_ = uVar3;
          uVar3 = *(undefined4 *)*(undefined1 (*) [64])beta_ptr;
          uVar4 = *(undefined4 *)(*(undefined1 (*) [64])beta_ptr + 4);
          auVar51 = vinsertf64x4_avx512f
                              (ZEXT3264(CONCAT1616(CONCAT412(uVar4,CONCAT48(uVar4,CONCAT44(uVar4,
                                                  uVar4))),CONCAT412(uVar3,CONCAT48(uVar3,CONCAT44(
                                                  uVar3,uVar3))))),auVar98,1);
          auVar52 = vfmadd132ps_avx512f(*(undefined1 (*) [64])ptr,auVar57,auVar66);
          auVar72 = vfmadd213ps_avx512f(auVar52,auVar72,auVar51);
          *(undefined1 (*) [64])ptr = auVar72;
          ptr = (float *)((long)ptr + 0x40);
          gamma_ptr = (float *)(*(undefined1 (*) [64])gamma_ptr + 0x10);
          beta_ptr = (float *)(*(undefined1 (*) [64])beta_ptr + 0x10);
          uVar42 = uVar43 + 0x10;
          iVar44 = uVar43 + 0x1f;
          uVar43 = uVar42;
        } while (iVar44 < (int)uVar38);
      }
      if ((int)(uVar42 + 7) < (int)uVar38) {
        auVar31._8_4_ = 0x80000000;
        auVar31._0_8_ = 0x8000000080000000;
        auVar31._12_4_ = 0x80000000;
        auVar31._16_4_ = 0x80000000;
        auVar31._20_4_ = 0x80000000;
        auVar31._24_4_ = 0x80000000;
        auVar31._28_4_ = 0x80000000;
        auVar48 = vxorps_avx512vl(auVar49,auVar31);
        uVar43 = uVar42;
        do {
          uVar3 = *(undefined4 *)*(undefined1 (*) [64])gamma_ptr;
          auVar96._4_4_ = uVar3;
          auVar96._0_4_ = uVar3;
          auVar96._8_4_ = uVar3;
          auVar96._12_4_ = uVar3;
          uVar3 = *(undefined4 *)(*(undefined1 (*) [64])gamma_ptr + 4);
          auVar96._20_4_ = uVar3;
          auVar96._16_4_ = uVar3;
          auVar96._24_4_ = uVar3;
          auVar96._28_4_ = uVar3;
          uVar3 = *(undefined4 *)*(undefined1 (*) [64])beta_ptr;
          auVar99._4_4_ = uVar3;
          auVar99._0_4_ = uVar3;
          auVar99._8_4_ = uVar3;
          auVar99._12_4_ = uVar3;
          uVar3 = *(undefined4 *)(*(undefined1 (*) [64])beta_ptr + 4);
          auVar99._20_4_ = uVar3;
          auVar99._16_4_ = uVar3;
          auVar99._24_4_ = uVar3;
          auVar99._28_4_ = uVar3;
          auVar46 = vfmadd132ps_fma(*(undefined1 (*) [32])*(undefined1 (*) [64])ptr,auVar48,auVar88)
          ;
          auVar46 = vfmadd213ps_fma(ZEXT1632(auVar46),auVar96,auVar99);
          *(undefined1 (*) [32])*(undefined1 (*) [64])ptr = ZEXT1632(auVar46);
          ptr = (float *)(*(undefined1 (*) [64])ptr + 0x20);
          gamma_ptr = (float *)(*(undefined1 (*) [64])gamma_ptr + 8);
          beta_ptr = (float *)(*(undefined1 (*) [64])beta_ptr + 8);
          uVar42 = uVar43 + 8;
          iVar44 = uVar43 + 0xf;
          uVar43 = uVar42;
        } while (iVar44 < (int)uVar38);
      }
      if ((int)(uVar42 + 3) < (int)uVar38) {
        auVar25._8_4_ = 0x80000000;
        auVar25._0_8_ = 0x8000000080000000;
        auVar25._12_4_ = 0x80000000;
        auVar46 = vxorps_avx512vl(auVar61,auVar25);
        uVar43 = uVar42;
        do {
          uVar3 = *(undefined4 *)*(undefined1 (*) [64])gamma_ptr;
          auVar93._4_4_ = uVar3;
          auVar93._0_4_ = uVar3;
          auVar93._8_4_ = uVar3;
          auVar93._12_4_ = uVar3;
          auVar47 = vfmadd132ps_fma(*(undefined1 (*) [16])*(undefined1 (*) [64])ptr,auVar46,auVar58)
          ;
          uVar3 = *(undefined4 *)*(undefined1 (*) [64])beta_ptr;
          auVar26._4_4_ = uVar3;
          auVar26._0_4_ = uVar3;
          auVar26._8_4_ = uVar3;
          auVar26._12_4_ = uVar3;
          auVar47 = vfmadd213ps_avx512vl(auVar47,auVar93,auVar26);
          *(undefined1 (*) [16])*(undefined1 (*) [64])ptr = auVar47;
          ptr = (float *)(*(undefined1 (*) [64])ptr + 0x10);
          gamma_ptr = (float *)(*(undefined1 (*) [64])gamma_ptr + 4);
          beta_ptr = (float *)(*(undefined1 (*) [64])beta_ptr + 4);
          uVar42 = uVar43 + 4;
          iVar44 = uVar43 + 7;
          uVar43 = uVar42;
        } while (iVar44 < (int)uVar38);
      }
    }
    if (bVar8) {
      if ((int)(uVar42 + 0xf) < (int)uVar38) {
        auVar35._8_4_ = 0x80000000;
        auVar35._0_8_ = 0x8000000080000000;
        auVar35._12_4_ = 0x80000000;
        auVar35._16_4_ = 0x80000000;
        auVar35._20_4_ = 0x80000000;
        auVar35._24_4_ = 0x80000000;
        auVar35._28_4_ = 0x80000000;
        auVar35._32_4_ = 0x80000000;
        auVar35._36_4_ = 0x80000000;
        auVar35._40_4_ = 0x80000000;
        auVar35._44_4_ = 0x80000000;
        auVar35._48_4_ = 0x80000000;
        auVar35._52_4_ = 0x80000000;
        auVar35._56_4_ = 0x80000000;
        auVar35._60_4_ = 0x80000000;
        auVar57 = vxorps_avx512dq(auVar80,auVar35);
        uVar43 = uVar42;
        do {
          auVar80 = vfmadd132ps_avx512f(*(undefined1 (*) [64])ptr,auVar57,auVar66);
          auVar80 = vfmadd213ps_avx512f(auVar80,*(undefined1 (*) [64])gamma_ptr,
                                        *(undefined1 (*) [64])beta_ptr);
          *(undefined1 (*) [64])ptr = auVar80;
          ptr = (float *)((long)ptr + 0x40);
          gamma_ptr = (float *)((long)gamma_ptr + 0x40);
          beta_ptr = (float *)((long)beta_ptr + 0x40);
          uVar42 = uVar43 + 0x10;
          iVar44 = uVar43 + 0x1f;
          uVar43 = uVar42;
        } while (iVar44 < (int)uVar38);
      }
      if ((int)(uVar42 + 7) < (int)uVar38) {
        auVar32._8_4_ = 0x80000000;
        auVar32._0_8_ = 0x8000000080000000;
        auVar32._12_4_ = 0x80000000;
        auVar32._16_4_ = 0x80000000;
        auVar32._20_4_ = 0x80000000;
        auVar32._24_4_ = 0x80000000;
        auVar32._28_4_ = 0x80000000;
        auVar48 = vxorps_avx512vl(auVar49,auVar32);
        uVar43 = uVar42;
        do {
          auVar46 = vfmadd132ps_fma(*(undefined1 (*) [32])*(undefined1 (*) [64])ptr,auVar48,auVar88)
          ;
          auVar46 = vfmadd213ps_fma(ZEXT1632(auVar46),
                                    *(undefined1 (*) [32])*(undefined1 (*) [64])gamma_ptr,
                                    *(undefined1 (*) [32])*(undefined1 (*) [64])beta_ptr);
          *(undefined1 (*) [32])*(undefined1 (*) [64])ptr = ZEXT1632(auVar46);
          ptr = (float *)(*(undefined1 (*) [64])ptr + 0x20);
          gamma_ptr = (float *)(*(undefined1 (*) [64])gamma_ptr + 0x20);
          beta_ptr = (float *)(*(undefined1 (*) [64])beta_ptr + 0x20);
          uVar42 = uVar43 + 8;
          iVar44 = uVar43 + 0xf;
          uVar43 = uVar42;
        } while (iVar44 < (int)uVar38);
      }
      if ((int)(uVar42 + 3) < (int)uVar38) {
        auVar27._8_4_ = 0x80000000;
        auVar27._0_8_ = 0x8000000080000000;
        auVar27._12_4_ = 0x80000000;
        auVar46 = vxorps_avx512vl(auVar61,auVar27);
        uVar43 = uVar42;
        do {
          auVar47 = vfmadd132ps_fma(*(undefined1 (*) [16])*(undefined1 (*) [64])ptr,auVar46,auVar58)
          ;
          auVar47 = vfmadd213ps_fma(auVar47,*(undefined1 (*) [16])*(undefined1 (*) [64])gamma_ptr,
                                    *(undefined1 (*) [16])*(undefined1 (*) [64])beta_ptr);
          *(undefined1 (*) [16])*(undefined1 (*) [64])ptr = auVar47;
          ptr = (float *)(*(undefined1 (*) [64])ptr + 0x10);
          gamma_ptr = (float *)(*(undefined1 (*) [64])gamma_ptr + 0x10);
          beta_ptr = (float *)(*(undefined1 (*) [64])beta_ptr + 0x10);
          uVar42 = uVar43 + 4;
          iVar44 = uVar43 + 7;
          uVar43 = uVar42;
        } while (iVar44 < (int)uVar38);
      }
    }
    if (uVar38 - uVar42 != 0 && (int)uVar42 <= (int)uVar38) {
      lVar39 = 0;
      do {
        auVar46 = vfnmadd132ss_fma(ZEXT416(*(uint *)(*(undefined1 (*) [64])ptr + lVar39 * 4)),
                                   auVar60,auVar59);
        auVar46 = vfnmadd213ss_fma(ZEXT416(*(uint *)(*(undefined1 (*) [64])gamma_ptr + lVar39 * 4)),
                                   auVar46,ZEXT416(*(uint *)(*(undefined1 (*) [64])beta_ptr +
                                                            lVar39 * 4)));
        *(int *)(*(undefined1 (*) [64])ptr + lVar39 * 4) = auVar46._0_4_;
        lVar39 = lVar39 + 1;
      } while (uVar38 - uVar42 != (int)lVar39);
    }
  }
  return;
}

Assistant:

static void layernorm(float* ptr, const float* gamma_ptr, const float* beta_ptr, float eps, int elemcount, int elempack)
{
    const int size = elemcount * elempack;

#if __SSE2__
#if __AVX__
#if __AVX512F__
    __m512 _mean_avx512 = _mm512_set1_ps(0.f);
#endif // __AVX512F__
    __m256 _mean_avx = _mm256_set1_ps(0.f);
#endif // __AVX__
    __m128 _mean = _mm_set1_ps(0.f);
#endif // __SSE2__
    float mean = 0.f;
    {
        const float* ptr0 = ptr;

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr0);
            _mean_avx512 = _mm512_add_ps(_mean_avx512, _p);
            ptr0 += 16;
        }
#endif // __AVX512F__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr0);
            _mean_avx = _mm256_add_ps(_mean_avx, _p);
            ptr0 += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_loadu_ps(ptr0);
            _mean = _mm_add_ps(_mean, _p);
            ptr0 += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            mean += ptr0[0];
            ptr0++;
        }
    }

#if __SSE2__
#if __AVX__
#if __AVX512F__
    if (elempack == 16)
    {
        __m512 _elemcount = _mm512_set1_ps((float)elemcount);
        _mean_avx512 = _mm512_div_ps(_mean_avx512, _elemcount);
    }
#endif // __AVX512F__
    if (elempack == 8)
    {
#if __AVX512F__
        {
            __m256 _mean0 = _mm512_castps512_ps256(_mean_avx512);
            __m256 _mean1 = _mm256_castpd_ps(_mm512_extractf64x4_pd(_mm512_castps_pd(_mean_avx512), 1));
            _mean_avx = _mm256_add_ps(_mean_avx, _mean0);
            _mean_avx = _mm256_add_ps(_mean_avx, _mean1);
        }
#endif // __AVX512F__

        __m256 _elemcount = _mm256_set1_ps((float)elemcount);
        _mean_avx = _mm256_div_ps(_mean_avx, _elemcount);
#if __AVX512F__
        _mean_avx512 = _mm512_insertf32x8(_mm512_castps256_ps512(_mean_avx), _mean_avx, 1);
#endif // __AVX512F__
    }
#endif // __AVX__
    if (elempack == 4)
    {
#if __AVX__
#if __AVX512F__
        {
            __m256 _mean0 = _mm512_castps512_ps256(_mean_avx512);
            __m256 _mean1 = _mm256_castpd_ps(_mm512_extractf64x4_pd(_mm512_castps_pd(_mean_avx512), 1));
            _mean_avx = _mm256_add_ps(_mean_avx, _mean0);
            _mean_avx = _mm256_add_ps(_mean_avx, _mean1);
        }
#endif // __AVX512F__
        {
            __m128 _mean0 = _mm256_castps256_ps128(_mean_avx);
            __m128 _mean1 = _mm256_extractf128_ps(_mean_avx, 1);
            _mean = _mm_add_ps(_mean, _mean0);
            _mean = _mm_add_ps(_mean, _mean1);
        }
#endif // __AVX__

        __m128 _elemcount = _mm_set1_ps((float)elemcount);
        _mean = _mm_div_ps(_mean, _elemcount);
#if __AVX__
        _mean_avx = _mm256_insertf128_ps(_mm256_castps128_ps256(_mean), _mean, 1);
#if __AVX512F__
        _mean_avx512 = _mm512_insertf32x8(_mm512_castps256_ps512(_mean_avx), _mean_avx, 1);
#endif // __AVX512F__
#endif // __AVX__
    }
#endif // __SSE2__
    if (elempack == 1)
    {
#if __SSE2__
#if __AVX__
#if __AVX512F__
        mean += _mm512_comp_reduce_add_ps(_mean_avx512);
#endif // __AVX512F__
        mean += _mm256_reduce_add_ps(_mean_avx);
#endif // __AVX__
        mean += _mm_reduce_add_ps(_mean);
#endif // __SSE2__

        mean = mean / elemcount;
#if __SSE2__
        _mean = _mm_set1_ps(mean);
#if __AVX__
        _mean_avx = _mm256_insertf128_ps(_mm256_castps128_ps256(_mean), _mean, 1);
#if __AVX512F__
        _mean_avx512 = _mm512_insertf32x8(_mm512_castps256_ps512(_mean_avx), _mean_avx, 1);
#endif // __AVX512F__
#endif // __AVX__
#endif // __SSE2__
    }

#if __SSE2__
#if __AVX__
#if __AVX512F__
    __m512 _var_avx512 = _mm512_set1_ps(0.f);
#endif // __AVX512F__
    __m256 _var_avx = _mm256_set1_ps(0.f);
#endif // __AVX__
    __m128 _var = _mm_set1_ps(0.f);
#endif // __SSE2__
    float var = 0.f;
    {
        const float* ptr0 = ptr;

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr0);
            _p = _mm512_sub_ps(_p, _mean_avx512);
            _var_avx512 = _mm512_fmadd_ps(_p, _p, _var_avx512);
            ptr0 += 16;
        }
#endif // __AVX512F__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr0);
            _p = _mm256_sub_ps(_p, _mean_avx);
            _var_avx = _mm256_comp_fmadd_ps(_p, _p, _var_avx);
            ptr0 += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_loadu_ps(ptr0);
            _p = _mm_sub_ps(_p, _mean);
            _var = _mm_comp_fmadd_ps(_p, _p, _var);
            ptr0 += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            float v = ptr0[0] - mean;
            var += v * v;
            ptr0++;
        }
    }

#if __SSE2__
#if __AVX__
#if __AVX512F__
    if (elempack == 16)
    {
        __m512 _elemcount = _mm512_set1_ps((float)elemcount);
        __m512 _eps = _mm512_set1_ps(eps);
        _var_avx512 = _mm512_div_ps(_var_avx512, _elemcount);
        _var_avx512 = _mm512_add_ps(_var_avx512, _eps);
        __m256 _var0 = _mm256_rsqrt_ps(_mm512_extractf32x8_ps(_var_avx512, 0));
        __m256 _var1 = _mm256_rsqrt_ps(_mm512_extractf32x8_ps(_var_avx512, 1));
        _var_avx512 = _mm512_insertf32x8(_mm512_castps256_ps512(_var0), _var1, 1);
        _mean_avx512 = _mm512_mul_ps(_mean_avx512, _var_avx512);
    }
#endif // __AVX512F__
    if (elempack == 8)
    {
#if __AVX512F__
        {
            __m256 _var0 = _mm512_castps512_ps256(_var_avx512);
            __m256 _var1 = _mm256_castpd_ps(_mm512_extractf64x4_pd(_mm512_castps_pd(_var_avx512), 1));
            _var_avx = _mm256_add_ps(_var_avx, _var0);
            _var_avx = _mm256_add_ps(_var_avx, _var1);
        }
#endif // __AVX512F__

        __m256 _elemcount = _mm256_set1_ps((float)elemcount);
        __m256 _eps = _mm256_set1_ps(eps);
        _var_avx = _mm256_div_ps(_var_avx, _elemcount);
        _var_avx = _mm256_add_ps(_var_avx, _eps);
        _var_avx = _mm256_rsqrt_ps(_var_avx);
        _mean_avx = _mm256_mul_ps(_mean_avx, _var_avx);
#if __AVX512F__
        _var_avx512 = _mm512_insertf32x8(_mm512_castps256_ps512(_var_avx), _var_avx, 1);
        _mean_avx512 = _mm512_insertf32x8(_mm512_castps256_ps512(_mean_avx), _mean_avx, 1);
#endif // __AVX512F__
    }
#endif // __AVX__
    if (elempack == 4)
    {
#if __AVX__
#if __AVX512F__
        {
            __m256 _var0 = _mm512_castps512_ps256(_var_avx512);
            __m256 _var1 = _mm256_castpd_ps(_mm512_extractf64x4_pd(_mm512_castps_pd(_var_avx512), 1));
            _var_avx = _mm256_add_ps(_var_avx, _var0);
            _var_avx = _mm256_add_ps(_var_avx, _var1);
        }
#endif // __AVX512F__
        {
            __m128 _var0 = _mm256_castps256_ps128(_var_avx);
            __m128 _var1 = _mm256_extractf128_ps(_var_avx, 1);
            _var = _mm_add_ps(_var, _var0);
            _var = _mm_add_ps(_var, _var1);
        }
#endif // __AVX__

        __m128 _elemcount = _mm_set1_ps((float)elemcount);
        __m128 _eps = _mm_set1_ps(eps);
        _var = _mm_div_ps(_var, _elemcount);
        _var = _mm_add_ps(_var, _eps);
        _var = _mm_rsqrt_ps(_var);
        _mean = _mm_mul_ps(_mean, _var);
#if __AVX__
        _var_avx = _mm256_insertf128_ps(_mm256_castps128_ps256(_var), _var, 1);
        _mean_avx = _mm256_insertf128_ps(_mm256_castps128_ps256(_mean), _mean, 1);
#if __AVX512F__
        _var_avx512 = _mm512_insertf32x8(_mm512_castps256_ps512(_var_avx), _var_avx, 1);
        _mean_avx512 = _mm512_insertf32x8(_mm512_castps256_ps512(_mean_avx), _mean_avx, 1);
#endif // __AVX512F__
#endif // __AVX__
    }
#endif // __SSE2__
    if (elempack == 1)
    {
#if __SSE2__
#if __AVX__
#if __AVX512F__
        var += _mm512_comp_reduce_add_ps(_var_avx512);
#endif // __AVX512F__
        var += _mm256_reduce_add_ps(_var_avx);
#endif // __AVX__
        var += _mm_reduce_add_ps(_var);
#endif // __SSE2__

        var = 1.f / sqrtf(var / elemcount + eps);
        mean = mean * var;
#if __SSE2__
        _var = _mm_set1_ps(var);
        _mean = _mm_set1_ps(mean);
#if __AVX__
        _var_avx = _mm256_insertf128_ps(_mm256_castps128_ps256(_var), _var, 1);
        _mean_avx = _mm256_insertf128_ps(_mm256_castps128_ps256(_mean), _mean, 1);
#if __AVX512F__
        _var_avx512 = _mm512_insertf32x8(_mm512_castps256_ps512(_var_avx), _var_avx, 1);
        _mean_avx512 = _mm512_insertf32x8(_mm512_castps256_ps512(_mean_avx), _mean_avx, 1);
#endif // __AVX512F__
#endif // __AVX__
#endif // __SSE2__
    }

    if (gamma_ptr && beta_ptr)
    {
        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        if (elempack == 16)
        {
            for (; i + 15 < size; i += 16)
            {
                __m512 _p = _mm512_loadu_ps(ptr);
                __m512 _gamma = _mm512_set1_ps(gamma_ptr[0]);
                __m512 _beta = _mm512_set1_ps(beta_ptr[0]);
                _p = _mm512_fmsub_ps(_p, _var_avx512, _mean_avx512);
                _p = _mm512_fmadd_ps(_p, _gamma, _beta);
                _mm512_storeu_ps(ptr, _p);
                ptr += 16;
                gamma_ptr += 1;
                beta_ptr += 1;
            }
        }
#endif // __AVX512F__
        if (elempack == 8)
        {
#if __AVX512F__
            for (; i + 15 < size; i += 16)
            {
                __m512 _p = _mm512_loadu_ps(ptr);
                __m256 _gamma0 = _mm256_set1_ps(gamma_ptr[0]);
                __m256 _gamma1 = _mm256_set1_ps(gamma_ptr[1]);
                __m512 _gamma = _mm512_insertf32x8(_mm512_castps256_ps512(_gamma0), _gamma1, 1);
                __m256 _beta0 = _mm256_set1_ps(beta_ptr[0]);
                __m256 _beta1 = _mm256_set1_ps(beta_ptr[1]);
                __m512 _beta = _mm512_insertf32x8(_mm512_castps256_ps512(_beta0), _beta1, 1);
                _p = _mm512_fmsub_ps(_p, _var_avx512, _mean_avx512);
                _p = _mm512_fmadd_ps(_p, _gamma, _beta);
                _mm512_storeu_ps(ptr, _p);
                ptr += 16;
                gamma_ptr += 2;
                beta_ptr += 2;
            }
#endif // __AVX512F__
            for (; i + 7 < size; i += 8)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                __m256 _gamma = _mm256_set1_ps(gamma_ptr[0]);
                __m256 _beta = _mm256_set1_ps(beta_ptr[0]);
                _p = _mm256_comp_fmsub_ps(_p, _var_avx, _mean_avx);
                _p = _mm256_comp_fmadd_ps(_p, _gamma, _beta);
                _mm256_storeu_ps(ptr, _p);
                ptr += 8;
                gamma_ptr += 1;
                beta_ptr += 1;
            }
        }
#endif // __AVX__
        if (elempack == 4)
        {
#if __AVX__
#if __AVX512F__
            for (; i + 15 < size; i += 16)
            {
                __m512 _p = _mm512_loadu_ps(ptr);
                __m128 _gamma0 = _mm_set1_ps(gamma_ptr[0]);
                __m128 _gamma1 = _mm_set1_ps(gamma_ptr[1]);
                __m128 _gamma2 = _mm_set1_ps(gamma_ptr[2]);
                __m128 _gamma3 = _mm_set1_ps(gamma_ptr[3]);
                __m256 _gamma01 = _mm256_insertf128_ps(_mm256_castps128_ps256(_gamma0), _gamma1, 1);
                __m256 _gamma23 = _mm256_insertf128_ps(_mm256_castps128_ps256(_gamma2), _gamma3, 1);
                __m512 _gamma = _mm512_insertf32x8(_mm512_castps256_ps512(_gamma01), _gamma23, 1);
                __m128 _beta0 = _mm_set1_ps(beta_ptr[0]);
                __m128 _beta1 = _mm_set1_ps(beta_ptr[1]);
                __m128 _beta2 = _mm_set1_ps(beta_ptr[2]);
                __m128 _beta3 = _mm_set1_ps(beta_ptr[3]);
                __m256 _beta01 = _mm256_insertf128_ps(_mm256_castps128_ps256(_beta0), _beta1, 1);
                __m256 _beta23 = _mm256_insertf128_ps(_mm256_castps128_ps256(_beta2), _beta3, 1);
                __m512 _beta = _mm512_insertf32x8(_mm512_castps256_ps512(_beta01), _beta23, 1);
                _p = _mm512_fmsub_ps(_p, _var_avx512, _mean_avx512);
                _p = _mm512_fmadd_ps(_p, _gamma, _beta);
                _mm512_storeu_ps(ptr, _p);
                ptr += 16;
                gamma_ptr += 4;
                beta_ptr += 4;
            }
#endif // __AVX512F__
            for (; i + 7 < size; i += 8)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                __m128 _gamma0 = _mm_set1_ps(gamma_ptr[0]);
                __m128 _gamma1 = _mm_set1_ps(gamma_ptr[1]);
                __m256 _gamma = _mm256_insertf128_ps(_mm256_castps128_ps256(_gamma0), _gamma1, 1);
                __m128 _beta0 = _mm_set1_ps(beta_ptr[0]);
                __m128 _beta1 = _mm_set1_ps(beta_ptr[1]);
                __m256 _beta = _mm256_insertf128_ps(_mm256_castps128_ps256(_beta0), _beta1, 1);
                _p = _mm256_comp_fmsub_ps(_p, _var_avx, _mean_avx);
                _p = _mm256_comp_fmadd_ps(_p, _gamma, _beta);
                _mm256_storeu_ps(ptr, _p);
                ptr += 8;
                gamma_ptr += 2;
                beta_ptr += 2;
            }
#endif // __AVX__
            for (; i + 3 < size; i += 4)
            {
                __m128 _p = _mm_loadu_ps(ptr);
                __m128 _gamma = _mm_set1_ps(gamma_ptr[0]);
                __m128 _beta = _mm_set1_ps(beta_ptr[0]);
                _p = _mm_comp_fmsub_ps(_p, _var, _mean);
                _p = _mm_comp_fmadd_ps(_p, _gamma, _beta);
                _mm_storeu_ps(ptr, _p);
                ptr += 4;
                gamma_ptr += 1;
                beta_ptr += 1;
            }
        }
        if (elempack == 1)
        {
#if __AVX__
#if __AVX512F__
            for (; i + 15 < size; i += 16)
            {
                __m512 _p = _mm512_loadu_ps(ptr);
                __m512 _gamma = _mm512_loadu_ps(gamma_ptr);
                __m512 _beta = _mm512_loadu_ps(beta_ptr);
                _p = _mm512_fmsub_ps(_p, _var_avx512, _mean_avx512);
                _p = _mm512_fmadd_ps(_p, _gamma, _beta);
                _mm512_storeu_ps(ptr, _p);
                ptr += 16;
                gamma_ptr += 16;
                beta_ptr += 16;
            }
#endif // __AVX512F__
            for (; i + 7 < size; i += 8)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                __m256 _gamma = _mm256_loadu_ps(gamma_ptr);
                __m256 _beta = _mm256_loadu_ps(beta_ptr);
                _p = _mm256_comp_fmsub_ps(_p, _var_avx, _mean_avx);
                _p = _mm256_comp_fmadd_ps(_p, _gamma, _beta);
                _mm256_storeu_ps(ptr, _p);
                ptr += 8;
                gamma_ptr += 8;
                beta_ptr += 8;
            }
#endif // __AVX__
            for (; i + 3 < size; i += 4)
            {
                __m128 _p = _mm_loadu_ps(ptr);
                __m128 _gamma = _mm_loadu_ps(gamma_ptr);
                __m128 _beta = _mm_loadu_ps(beta_ptr);
                _p = _mm_comp_fmsub_ps(_p, _var, _mean);
                _p = _mm_comp_fmadd_ps(_p, _gamma, _beta);
                _mm_storeu_ps(ptr, _p);
                ptr += 4;
                gamma_ptr += 4;
                beta_ptr += 4;
            }
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            ptr[0] = (ptr[0] * var - mean) * gamma_ptr[0] + beta_ptr[0];
            ptr++;
            gamma_ptr++;
            beta_ptr++;
        }
    }
    else
    {
        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _p = _mm512_fmsub_ps(_p, _var_avx512, _mean_avx512);
            _mm512_storeu_ps(ptr, _p);
            ptr += 16;
        }
#endif // __AVX512F__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = _mm256_comp_fmsub_ps(_p, _var_avx, _mean_avx);
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_loadu_ps(ptr);
            _p = _mm_comp_fmsub_ps(_p, _var, _mean);
            _mm_storeu_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            ptr[0] = ptr[0] * var - mean;
            ptr++;
        }
    }
}